

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nurbs.h
# Opt level: O3

Index anurbs::Nurbs::
      lower_bound<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>,0,Eigen::InnerStride<1>>>
                (Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *values,
                Index first,Index last,double value)

{
  double *pdVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  
  uVar4 = last - first;
  if (uVar4 != 0 && first <= last) {
    do {
      uVar2 = uVar4 >> 1;
      lVar3 = first + uVar2;
      if ((lVar3 < 0) ||
         (*(long *)&(values->
                    super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
                    ).field_0x8 <= lVar3)) {
        __assert_fail("index >= 0 && index < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/oberbichler[P]ANurbs/external_libraries/Eigen/src/Core/DenseCoeffsBase.h"
                      ,0x198,
                      "Scalar &Eigen::DenseCoeffsBase<Eigen::Ref<Eigen::Matrix<double, -1, 1>>, 1>::operator[](Index) [Derived = Eigen::Ref<Eigen::Matrix<double, -1, 1>>, Level = 1]"
                     );
      }
      pdVar1 = (double *)
               (*(long *)&values->
                          super_RefBase<Eigen::Ref<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>_>
               + lVar3 * 8);
      if (*pdVar1 <= value && value != *pdVar1) {
        first = lVar3 + 1;
        uVar2 = ~uVar2 + uVar4;
      }
      uVar4 = uVar2;
    } while (0 < (long)uVar2);
  }
  return first;
}

Assistant:

static Index lower_bound(TKnots values, Index first, Index last, double value)
    {
        auto count = last - first;
        Index i, step;
    
        while (count > 0) {
            i = first; 
            step = count / 2; 
            i += step;
            if (values[i] < value) {
                first = ++i; 
                count -= step + 1; 
            } else {
                count = step;
            }
        }
        return first;
    }